

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O0

dynhds_entry * entry_new(char *name,size_t namelen,char *value,size_t valuelen,int opts)

{
  char *__dest;
  char *p;
  dynhds_entry *e;
  int opts_local;
  size_t valuelen_local;
  char *value_local;
  size_t namelen_local;
  char *name_local;
  
  name_local = (char *)(*Curl_ccalloc)(1,namelen + valuelen + 0x22);
  if (name_local == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    __dest = name_local + 0x20;
    *(char **)name_local = __dest;
    memcpy(__dest,name,namelen);
    *(size_t *)(name_local + 0x10) = namelen;
    *(char **)(name_local + 8) = __dest + namelen + 1;
    memcpy(__dest + namelen + 1,value,valuelen);
    *(size_t *)(name_local + 0x18) = valuelen;
    if ((opts & 1U) != 0) {
      Curl_strntolower(*(char **)name_local,*(char **)name_local,*(size_t *)(name_local + 0x10));
    }
  }
  return (dynhds_entry *)name_local;
}

Assistant:

static struct dynhds_entry *
entry_new(const char *name, size_t namelen,
          const char *value, size_t valuelen, int opts)
{
  struct dynhds_entry *e;
  char *p;

  DEBUGASSERT(name);
  DEBUGASSERT(value);
  e = calloc(1, sizeof(*e) + namelen + valuelen + 2);
  if(!e)
    return NULL;
  e->name = p = ((char *)e) + sizeof(*e);
  memcpy(p, name, namelen);
  e->namelen = namelen;
  e->value = p += namelen + 1; /* leave a \0 at the end of name */
  memcpy(p, value, valuelen);
  e->valuelen = valuelen;
  if(opts & DYNHDS_OPT_LOWERCASE)
    Curl_strntolower(e->name, e->name, e->namelen);
  return e;
}